

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

uint32_t helper_usat16_aarch64(CPUARMState_conflict *env,uint32_t x,uint32_t shift)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (uint)(short)x;
  if ((short)x < 0) {
    uVar2 = 0;
LAB_00629bc2:
    uVar1 = uVar2;
    env->QF = 1;
  }
  else {
    uVar2 = ~(-1 << ((byte)shift & 0x1f));
    if (uVar2 < uVar1) goto LAB_00629bc2;
  }
  uVar2 = (int)x >> 0x10;
  if ((int)uVar2 < 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = ~(-1 << ((byte)shift & 0x1f));
    if (uVar2 <= uVar3) goto LAB_00629bf0;
  }
  uVar2 = uVar3;
  env->QF = 1;
LAB_00629bf0:
  return uVar2 * 0x10000 + uVar1;
}

Assistant:

uint32_t HELPER(usat16)(CPUARMState *env, uint32_t x, uint32_t shift)
{
    uint32_t res;

    res = (uint16_t)do_usat(env, (int16_t)x, shift);
    res |= do_usat(env, ((int32_t)x) >> 16, shift) << 16;
    return res;
}